

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<QString,QList<QString>>::emplace_helper<QList<QString>>
          (QHash<QString,QList<QString>> *this,QString *key,QList<QString> *args)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  Data *pDVar4;
  QString *pQVar5;
  piter pVar6;
  Node<QString,QList<QString>> *this_00;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<QString,_QList<QString>_>_>::findOrInsert<QString>
            ((InsertionResult *)local_38,
             *(Data<QHashPrivate::Node<QString,_QList<QString>_>_> **)this,key);
  this_00 = (Node<QString,QList<QString>> *)
            ((((*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].entries)->storage).
             data + (uint)(*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].offsets
                          [(uint)local_38._8_8_ & 0x7f] * 0x30);
  if (local_38[0x10] == false) {
    pDVar1 = (key->d).d;
    (key->d).d = (Data *)0x0;
    *(Data **)this_00 = pDVar1;
    pcVar2 = (key->d).ptr;
    (key->d).ptr = (char16_t *)0x0;
    *(char16_t **)(this_00 + 8) = pcVar2;
    qVar3 = (key->d).size;
    (key->d).size = 0;
    *(qsizetype *)(this_00 + 0x10) = qVar3;
    pDVar4 = (args->d).d;
    (args->d).d = (Data *)0x0;
    *(Data **)(this_00 + 0x18) = pDVar4;
    pQVar5 = (args->d).ptr;
    (args->d).ptr = (QString *)0x0;
    *(QString **)(this_00 + 0x20) = pQVar5;
    qVar3 = (args->d).size;
    (args->d).size = 0;
    *(qsizetype *)(this_00 + 0x28) = qVar3;
  }
  else {
    QHashPrivate::Node<QString,QList<QString>>::emplaceValue<QList<QString>>(this_00,args);
  }
  pVar6.bucket = local_38._8_8_;
  pVar6.d = (Data<QHashPrivate::Node<QString,_QList<QString>_>_> *)local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar6;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }